

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_b44ed7::HandleTransformCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  long lVar2;
  pointer pbVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  _Base_ptr *pp_Var15;
  unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  uVar16;
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  uVar17;
  transform_error *ptVar18;
  ActionDescriptor *__args;
  _Base_ptr p_Var19;
  ActionDescriptor *__args_00;
  pointer pbVar20;
  _Rb_tree_header *p_Var21;
  string *psVar22;
  _Link_type __node;
  _Rb_tree_header *p_Var23;
  _Base_ptr p_Var24;
  ulong uVar25;
  ulong uVar26;
  string_view separator;
  string_view value_00;
  string_view separator_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  _Base_ptr local_5b8;
  int value;
  string REGEX;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  undefined1 *local_508;
  char *local_500;
  undefined1 local_4f8 [8];
  _Invoker_type p_Stack_4f0;
  Command command;
  string local_458;
  string FOR;
  size_t pos;
  char *pcStack_410;
  code *local_408;
  code *pcStack_400;
  int local_3f8;
  _Any_data local_3f0;
  _Manager_type local_3e0;
  _Invoker_type p_Stack_3d8;
  undefined1 local_3d0 [72];
  undefined1 local_388 [72];
  undefined1 local_340 [72];
  undefined1 local_2f8 [72];
  undefined1 local_2b0 [72];
  undefined1 local_268 [72];
  string OUTPUT_VARIABLE;
  cmStringRange local_200;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pos,"sub-command TRANSFORM requires an action to be specified.",
               (allocator<char> *)&command);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&pos);
    return false;
  }
  command.Name._M_dataplus._M_p = (pointer)&command.Name.field_2;
  command.Name._M_string_length = 0;
  pbVar20 = pbVar20 + 1;
  command.Name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&command.ListName,(string *)pbVar20);
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  command.Action._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          )0x0;
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.Selector._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          )0x0;
  std::__cxx11::string::string((string *)&command.OutputName,(string *)pbVar20);
  pos = 0;
  pcStack_410 = (char *)0x0;
  pcStack_400 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:815:7)>
                ::_M_invoke;
  local_408 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:815:7)>
              ::_M_manager;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&descriptors,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&pos);
  p_Var21 = &descriptors._M_t._M_impl.super__Rb_tree_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var21->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var21->_M_header;
  std::_Function_base::~_Function_base((_Function_base *)&pos);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"APPEND",(allocator<char> *)&REGEX);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
             ::_M_manager;
  local_50._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (&pos,&local_130,1,(transform_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"PREPEND",(allocator<char> *)&AT);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
             ::_M_manager;
  local_70._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_3d0,&local_150,1,(transform_type *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"TOUPPER",(allocator<char> *)&FOR);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
             ::_M_manager;
  local_90._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_388,&local_170,0,(transform_type *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"TOLOWER",(allocator<char> *)&OUTPUT_VARIABLE);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
             ::_M_manager;
  local_b0._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_340,&local_190,0,(transform_type *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"STRIP",(allocator<char> *)&value);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
             ::_M_manager;
  local_d0._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_2f8,&local_1b0,0,(transform_type *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"GENEX_STRIP",(allocator<char> *)&local_458);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
             ::_M_manager;
  local_f0._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_2b0,&local_1d0,0,(transform_type *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"REPLACE",(allocator<char> *)&local_200);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
              ::_M_manager;
  local_110._M_unused._M_object = &command;
  (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std
  ::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::ActionDescriptor(std::__cxx11::
  string,int,std::function<std::__cxx11::string(std::__cxx11::string_const__>_
            (local_268,&local_1f0,2,(transform_type *)&local_110);
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = (_Base_ptr)0x0
    ;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_left;
    if ((_Base_ptr)
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (_Base_ptr)0x0) {
      varArgsExpanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    }
  }
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var21->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var21->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&descriptors;
  local_5b8 = (_Base_ptr)
              varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar14 = 0; p_Var21 = &descriptors._M_t._M_impl.super__Rb_tree_header, lVar14 != 0x1f8;
      lVar14 = lVar14 + 0x48) {
    __node = (_Link_type)((long)&pos + lVar14);
    if ((descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (bVar5 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 1)
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __node), !bVar5)) {
      bVar5 = true;
      pp_Var15 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var24 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header;
      while (p_Var19 = *pp_Var15, p_Var19 != (_Base_ptr)0x0) {
        bVar5 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var19 + 1));
        p_Var24 = p_Var19;
        pp_Var15 = &p_Var19->_M_left + !bVar5;
      }
      p_Var12 = p_Var24;
      if (bVar5 != false) {
        if (p_Var24 == descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          bVar5 = false;
          goto LAB_002b47ea;
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var24);
      }
      bVar5 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&descriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var12 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __node);
      if (bVar5) {
        bVar5 = p_Var12 != (_Rb_tree_node_base *)0x0 && !bVar5;
        goto LAB_002b47ea;
      }
    }
    else if (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      bVar5 = false;
      p_Var24 = descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_002b47ea:
      bVar6 = true;
      if (&descriptors._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var24 && !bVar5) {
        bVar6 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var24 + 1));
        local_5b8 = (_Base_ptr)
                    varArgsExpanded.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (local_5b8 == (_Rb_tree_node_base *)0x0) {
        local_5b8 = (_Base_ptr)operator_new(0x68);
        std::
        _Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
        ::
        _M_construct_node<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor_const&>
                  ((_Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
                    *)local_5b8,__node,__args);
        p_Var19 = (_Base_ptr)0x0;
      }
      else {
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5b8->_M_parent;
        if ((_Base_ptr)
            varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (_Base_ptr)0x0) {
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          p_Var19 = (_Base_ptr)0x0;
        }
        else {
          p_Var19 = (_Base_ptr)
                    varArgsExpanded.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (((_Base_ptr)
              varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_right == local_5b8) {
            ((_Base_ptr)
            varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_right = (_Base_ptr)0x0;
            p_Var4 = ((_Base_ptr)
                     varArgsExpanded.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_left;
            if (((_Base_ptr)
                varArgsExpanded.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_left != (_Base_ptr)0x0) {
              do {
                p_Var13 = p_Var4;
                p_Var4 = p_Var13->_M_right;
              } while (p_Var13->_M_right != (_Base_ptr)0x0);
              p_Var19 = p_Var13->_M_left;
              varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var19;
              if (p_Var19 == (_Base_ptr)0x0) {
                p_Var19 = p_Var13;
                varArgsExpanded.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var13;
              }
            }
          }
          else {
            ((_Base_ptr)
            varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_left = (_Base_ptr)0x0;
          }
        }
        HandleTransformCommand::ActionDescriptor::~ActionDescriptor
                  ((ActionDescriptor *)(local_5b8 + 1));
        std::
        _Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
        ::
        _M_construct_node<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor_const&>
                  ((_Rb_tree<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor,std::_Identity<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor>>
                    *)local_5b8,__node,__args_00);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar6,local_5b8,p_Var24,&descriptors._M_t._M_impl.super__Rb_tree_header._M_header);
      descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      local_5b8 = p_Var19;
    }
  }
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_Reuse_or_alloc_node::~_Reuse_or_alloc_node((_Reuse_or_alloc_node *)&varArgsExpanded);
  lVar14 = 0x1b0;
  do {
    HandleTransformCommand::ActionDescriptor::~ActionDescriptor
              ((ActionDescriptor *)((long)&pos + lVar14));
    lVar14 = lVar14 + -0x48;
  } while (lVar14 != -0x48);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__cxx11::string::~string((string *)&local_170);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string
            ((string *)&local_508,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  pos = (size_t)&local_408;
  if (local_508 == local_4f8) {
    pcStack_400 = p_Stack_4f0;
  }
  else {
    pos = (size_t)local_508;
  }
  pcStack_410 = local_500;
  local_508 = local_4f8;
  local_500 = (char *)0x0;
  local_4f8[0] = 0;
  local_3f8 = 0;
  local_3f0._M_unused._M_object = (void *)0x0;
  local_3f0._8_8_ = 0;
  local_3e0 = (_Manager_type)0x0;
  p_Stack_3d8 = (_Invoker_type)0x0;
  pp_Var15 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var24 = &p_Var21->_M_header;
  while (p_Var19 = *pp_Var15, (_Rb_tree_header *)p_Var19 != (_Rb_tree_header *)0x0) {
    bVar5 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&descriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var19 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
    if (!bVar5) {
      p_Var24 = p_Var19;
    }
    pp_Var15 = &p_Var19->_M_left + bVar5;
  }
  p_Var23 = p_Var21;
  if (((_Rb_tree_header *)p_Var24 != p_Var21) &&
     (bVar5 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&descriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &((_Rb_tree_header *)p_Var24)->_M_node_count),
     p_Var23 = (_Rb_tree_header *)p_Var24, bVar5)) {
    p_Var23 = p_Var21;
  }
  HandleTransformCommand::ActionDescriptor::~ActionDescriptor((ActionDescriptor *)&pos);
  std::__cxx11::string::~string((string *)&local_508);
  if (p_Var23 == p_Var21) {
    pos = 0x18;
    pcStack_410 = " sub-command TRANSFORM, ";
    pbVar20 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar20[2]._M_dataplus._M_p;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar20[2]._M_string_length;
    cmStrCat<char[17]>(&REGEX,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                       (char (*) [17])" invalid action.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if ((long)*(int *)((long)(p_Var23 + 1) + 0x18) + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&command);
      lVar14 = (long)*(int *)((long)(p_Var23 + 1) + 0x18);
      uVar25 = lVar14 + 3;
      if (0 < lVar14) {
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pos,
                   pbVar20 + 3,pbVar20 + uVar25,(allocator_type *)&varArgsExpanded);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&command.Arguments,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&pos);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pos);
      }
      bVar5 = std::operator==(&command.Name,"REPLACE");
      uVar16 = command.Action;
      if (bVar5) {
        pcVar1 = status->Makefile;
        uVar16._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
        .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
             (__uniq_ptr_data<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>,_true,_true>
              )operator_new(0x160);
        pbVar20 = command.Arguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined ***)
         uVar16._M_t.
         super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
         ._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
         .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
             &PTR__TransformReplace_007d22b0;
        std::__cxx11::string::string
                  ((string *)&REGEX,
                   (string *)
                   (command.Arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)
                   ((long)uVar16._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                          _M_head_impl + 8),pbVar20,&REGEX,pcVar1);
        std::__cxx11::string::~string((string *)&REGEX);
        cmMakefile::ClearMatches(pcVar1);
        if (*(long *)((long)uVar16._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl + 0x108) == 0) {
          ptVar18 = (transform_error *)__cxa_allocate_exception(0x10);
          pos = 0x40;
          pcStack_410 = "sub-command TRANSFORM, action REPLACE: Failed to compile regex \"";
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((command.Arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(command.Arguments.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          cmStrCat<char[3]>(&AT,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                            (char (*) [3])0x5b59a8);
          transform_error::transform_error(ptVar18,&AT);
          __cxa_throw(ptVar18,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)((long)uVar16._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl + 0x118) == '\0') {
          ptVar18 = (transform_error *)__cxa_allocate_exception(0x10);
          pos = 0x27;
          pcStack_410 = "sub-command TRANSFORM, action REPLACE: ";
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                ((long)uVar16._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                       _M_head_impl + 8);
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)uVar16._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                       _M_head_impl + 0x10);
          cmStrCat<char[2]>(&AT,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                            (char (*) [2])0x5b4eb0);
          transform_error::transform_error(ptVar18,&AT);
          __cxa_throw(ptVar18,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )command.Action._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl
            != (__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                )0x0) {
          lVar14 = *(long *)command.Action._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl;
          command.Action._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
               uVar16._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
          (**(code **)(lVar14 + 8))();
          uVar16._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
               command.Action._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
        }
      }
      command.Action._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
           uVar16._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&REGEX,"REGEX",(allocator<char> *)&pos);
      std::__cxx11::string::string<std::allocator<char>>((string *)&AT,"AT",(allocator<char> *)&pos)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&FOR,"FOR",(allocator<char> *)&pos);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&OUTPUT_VARIABLE,"OUTPUT_VARIABLE",(allocator<char> *)&pos);
      psVar22 = &status->Error;
      uVar17 = command.Selector;
LAB_002b4d86:
      command.Selector._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
           uVar17._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl;
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5) <= uVar25)
      {
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = GetList(&varArgsExpanded,&command.ListName,status->Makefile);
        if (bVar5) {
          uVar17 = command.Selector;
          if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )command.Selector._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl ==
              (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )0x0) {
            uVar17._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                  )operator_new(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,"NO SELECTOR",(allocator<char> *)&value);
            TransformSelector::TransformSelector
                      ((TransformSelector *)
                       uVar17._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                       _M_head_impl,(string *)&pos);
            std::__cxx11::string::~string((string *)&pos);
            *(undefined ***)
             uVar17._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelector_007d24b0;
            if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )command.Selector._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl !=
                (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )0x0) {
              lVar14 = *(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl;
              command.Selector._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = uVar17._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
              (**(code **)(lVar14 + 8))();
              uVar17._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
            }
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar17._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          (**(code **)(*(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl + 0x20))
                    (command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl,&varArgsExpanded,(long)(p_Var23 + 1) + 0x20);
          pcVar1 = status->Makefile;
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin((string *)&pos,&varArgsExpanded,separator,(string_view)ZEXT816(0));
          value_00._M_str = (char *)pos;
          value_00._M_len = (size_t)pcStack_410;
          cmMakefile::AddDefinition(pcVar1,&command.OutputName,value_00);
          std::__cxx11::string::~string((string *)&pos);
        }
        else {
          cmMakefile::AddDefinition
                    (status->Makefile,&command.OutputName,(string_view)(ZEXT816(0x61ebb9) << 0x40));
        }
        bVar5 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&varArgsExpanded);
        goto LAB_002b59cb;
      }
      _Var7 = std::operator==(pbVar20 + uVar25,&REGEX);
      if ((_Var7) ||
         (_Var7 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar25,&AT), _Var7))
      {
        if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             )command.Selector._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
            != (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                )0x0) goto LAB_002b534f;
LAB_002b4e12:
        _Var7 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&REGEX);
        if (_Var7) {
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar14 = uVar25 + 1;
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5 == lVar14) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,
                       "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                       ,(allocator<char> *)&varArgsExpanded);
            std::__cxx11::string::_M_assign((string *)psVar22);
            goto LAB_002b59bc;
          }
          uVar17._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                )operator_new(0xf8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pos,"REGEX",(allocator<char> *)&varArgsExpanded);
          TransformSelector::TransformSelector
                    ((TransformSelector *)
                     uVar17._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl,(string *)&pos);
          std::__cxx11::string::~string((string *)&pos);
          *(undefined ***)
           uVar17._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               &PTR__TransformSelectorRegex_007d2328;
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)
                     ((long)uVar17._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                            ._M_head_impl + 0x28),pbVar20 + lVar14);
          if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )command.Selector._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl !=
              (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )0x0) {
            lVar2 = *(long *)command.Selector._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl;
            command.Selector._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 uVar17._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl;
            (**(code **)(lVar2 + 8))();
            uVar17._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 command.Selector._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl;
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar17._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          cVar8 = (**(code **)(*(long *)command.Selector._M_t.
                                        super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                        .
                                        super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                        ._M_head_impl + 0x10))
                            (command.Selector._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl,0);
          if (cVar8 == '\0') {
            pos = 0x3f;
            pcStack_410 = "sub-command TRANSFORM, selector REGEX failed to compile regex \"";
            pbVar20 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar20[lVar14]._M_dataplus._M_p;
            varArgsExpanded.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar20[lVar14]._M_string_length;
            cmStrCat<char[3]>((string *)&value,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                              (char (*) [3])0x5b59a8);
            std::__cxx11::string::_M_assign((string *)psVar22);
            goto LAB_002b5453;
          }
          uVar25 = uVar25 + 2;
          uVar17 = command.Selector;
          goto LAB_002b4d86;
        }
        _Var7 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&AT);
        if (_Var7) {
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar14 = uVar25 * 0x20;
          while( true ) {
            uVar25 = uVar25 + 1;
            pbVar20 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (((ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5) <=
                 uVar25) ||
               (value = std::__cxx11::stoi((string *)((long)&pbVar20[1]._M_dataplus._M_p + lVar14),
                                           &pos,10),
               pos != *(size_t *)
                       ((long)&(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length +
                       lVar14))) break;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&varArgsExpanded,&value);
            lVar14 = lVar14 + 0x20;
          }
          pbVar3 = varArgsExpanded.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar20 = varArgsExpanded.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,
                       "sub-command TRANSFORM, selector AT expects at least one numeric value.",
                       (allocator<char> *)&value);
            std::__cxx11::string::_M_assign((string *)psVar22);
            std::__cxx11::string::~string((string *)&pos);
            uVar17 = command.Selector;
          }
          else {
            uVar17._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                  )operator_new(0x40);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,"AT",(allocator<char> *)&value);
            TransformSelector::TransformSelector
                      ((TransformSelector *)
                       uVar17._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                       _M_head_impl,(string *)&pos);
            *(undefined ***)
             uVar17._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelectorIndexes_007d2428;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)uVar17._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                              ._M_head_impl + 0x28),
                       (vector<int,_std::allocator<int>_> *)&varArgsExpanded);
            std::__cxx11::string::~string((string *)&pos);
            *(undefined ***)
             uVar17._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelectorIndexes_007d23c0;
            if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )command.Selector._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl !=
                (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )0x0) {
              lVar14 = *(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl;
              command.Selector._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = uVar17._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
              (**(code **)(lVar14 + 8))();
              uVar17._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
            }
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar17._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&varArgsExpanded);
          uVar17 = command.Selector;
          if (pbVar20 == pbVar3) goto LAB_002b59c9;
          goto LAB_002b4d86;
        }
        _Var7 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&FOR);
        if (_Var7) {
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar26 = uVar25 + 2;
          if (uVar26 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >>
                              5)) {
            iVar9 = std::__cxx11::stoi(pbVar20 + uVar25 + 1,&pos,10);
            pbVar20 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (pos == pbVar20[uVar25 + 1]._M_string_length) {
              iVar10 = std::__cxx11::stoi(pbVar20 + uVar26,&pos,10);
              pbVar20 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if (pos == pbVar20[uVar26]._M_string_length) {
                uVar26 = uVar25 + 3;
                if ((uVar26 < (ulong)((long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar20 >> 5)) &&
                   (iVar11 = std::__cxx11::stoi(pbVar20 + uVar26,&pos,10),
                   pos == (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar26]._M_string_length)) {
                  if (iVar11 < 1) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&pos,
                               "sub-command TRANSFORM, selector FOR expects positive numeric value for <step>."
                               ,(allocator<char> *)&varArgsExpanded);
                    std::__cxx11::string::_M_assign((string *)psVar22);
                    goto LAB_002b59bc;
                  }
                  uVar26 = uVar25 + 4;
                }
                else {
                  iVar11 = 1;
                }
                uVar17._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl = (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                                )operator_new(0x50);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pos,"FOR",(allocator<char> *)&varArgsExpanded);
                TransformSelector::TransformSelector
                          ((TransformSelector *)
                           uVar17._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                           ._M_head_impl,(string *)&pos);
                *(undefined ***)
                 uVar17._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl = &PTR__TransformSelectorIndexes_007d2428;
                ((TransformSelector *)
                ((long)uVar17._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                       _M_head_impl + 0x28))->_vptr_TransformSelector = (_func_int **)0x0;
                (((string *)
                 ((long)uVar17._M_t.
                        super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                        _M_head_impl + 0x30))->_M_dataplus)._M_p = (pointer)0x0;
                *(size_type *)
                 ((long)uVar17._M_t.
                        super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                        _M_head_impl + 0x38) = 0;
                std::__cxx11::string::~string((string *)&pos);
                *(undefined ***)
                 uVar17._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl = &PTR__TransformSelectorIndexes_007d2460;
                *(int *)((long)uVar17._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                               ._M_head_impl + 0x40) = iVar9;
                *(int *)((long)uVar17._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                               ._M_head_impl + 0x44) = iVar10;
                *(int *)((long)uVar17._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                               ._M_head_impl + 0x48) = iVar11;
                uVar25 = uVar26;
                if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     )command.Selector._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                      _M_head_impl !=
                    (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     )0x0) {
                  lVar14 = *(long *)command.Selector._M_t.
                                    super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                    .
                                    super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                    ._M_head_impl;
                  command.Selector._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl = uVar17._M_t.
                                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                 .
                                 super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                 ._M_head_impl;
                  (**(code **)(lVar14 + 8))();
                  uVar17._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl = command.Selector._M_t.
                                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                 .
                                 super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                 ._M_head_impl;
                }
                goto LAB_002b4d86;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,
                       "sub-command TRANSFORM, selector FOR expects, at least, two numeric values.",
                       (allocator<char> *)&varArgsExpanded);
            std::__cxx11::string::_M_assign((string *)psVar22);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,
                       "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                       (allocator<char> *)&varArgsExpanded);
            std::__cxx11::string::_M_assign((string *)psVar22);
          }
LAB_002b59bc:
          psVar22 = (string *)&pos;
          goto LAB_002b59c4;
        }
        _Var7 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&OUTPUT_VARIABLE
                               );
        if (_Var7) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5 == uVar25 + 1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pos,
                       "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                       (allocator<char> *)&varArgsExpanded);
            std::__cxx11::string::_M_assign((string *)psVar22);
            goto LAB_002b59bc;
          }
          uVar25 = uVar25 + 2;
          std::__cxx11::string::_M_assign((string *)&command.OutputName);
          uVar17 = command.Selector;
          goto LAB_002b4d86;
        }
        pos = 0x18;
        pcStack_410 = "sub-command TRANSFORM, \'";
        local_200.Begin._M_current =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar25;
        local_200.End._M_current =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        separator_00._M_str = " ";
        separator_00._M_len = 1;
        cmJoin(&local_458,&local_200,separator_00,(string_view)ZEXT816(0));
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_458._M_string_length;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_458._M_dataplus._M_p;
        cmStrCat<char[27]>((string *)&value,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                           (char (*) [27])"\': unexpected argument(s).");
        std::__cxx11::string::_M_assign((string *)psVar22);
        std::__cxx11::string::~string((string *)&value);
        psVar22 = &local_458;
      }
      else {
        _Var7 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&FOR);
        if (!_Var7 || (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       )command.Selector._M_t.
                        super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                        _M_head_impl ==
                      (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       )0x0) goto LAB_002b4e12;
LAB_002b534f:
        pos = 0x33;
        pcStack_410 = "sub-command TRANSFORM, selector already specified (";
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl + 8);
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl + 0x10);
        cmStrCat<char[3]>((string *)&value,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,
                          (char (*) [3])0x5bdadc);
        std::__cxx11::string::_M_assign((string *)psVar22);
LAB_002b5453:
        psVar22 = (string *)&value;
      }
LAB_002b59c4:
      std::__cxx11::string::~string((string *)psVar22);
      goto LAB_002b59c9;
    }
    pos = 0x1e;
    pcStack_410 = "sub-command TRANSFORM, action ";
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var23->_M_node_count;
    varArgsExpanded.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var23 + 1);
    cmStrCat<char[10],int,char[14]>
              (&REGEX,(cmAlphaNum *)&pos,(cmAlphaNum *)&varArgsExpanded,(char (*) [10])" expects ",
               (int *)((long)(p_Var23 + 1) + 0x18),(char (*) [14])0x5d8795);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&REGEX);
  bVar5 = false;
LAB_002b59ff:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set(&descriptors);
  HandleTransformCommand::Command::~Command(&command);
  return bVar5;
LAB_002b59c9:
  bVar5 = false;
LAB_002b59cb:
  std::__cxx11::string::~string((string *)&OUTPUT_VARIABLE);
  std::__cxx11::string::~string((string *)&FOR);
  std::__cxx11::string::~string((string *)&AT);
  std::__cxx11::string::~string((string *)&REGEX);
  goto LAB_002b59ff;
}

Assistant:

bool HandleTransformCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return this->Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmTrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    status.SetError(
      cmStrCat(" sub-command TRANSFORM, ", args[index], " invalid action."));
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    status.SetError(cmStrCat("sub-command TRANSFORM, action ",
                             descriptor->Name, " expects ", descriptor->Arity,
                             " argument(s)."));
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action = cm::make_unique<TransformReplace>(
        command.Arguments, &status.GetMakefile());
    } catch (const transform_error& e) {
      status.SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" };
  const std::string AT{ "AT" };
  const std::string FOR{ "FOR" };
  const std::string OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      status.SetError(
        cmStrCat("sub-command TRANSFORM, selector already specified (",
                 command.Selector->Tag, ")."));

      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, selector REGEX expects "
                        "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        status.SetError(
          cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
                   "regex \"",
                   args[index], "\"."));
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        status.SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        status.SetError(
          "sub-command TRANSFORM, selector FOR expects, at least,"
          " two arguments.");
        return false;
      }

      int start = 0;
      int stop = 0;
      int step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        status.SetError("sub-command TRANSFORM, selector FOR expects, "
                        "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step <= 0) {
        status.SetError("sub-command TRANSFORM, selector FOR expects "
                        "positive numeric value for <step>.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                        "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    status.SetError(cmStrCat("sub-command TRANSFORM, '",
                             cmJoin(cmMakeRange(args).advance(index), " "),
                             "': unexpected argument(s)."));
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, command.ListName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    status.SetError(e.what());
    return false;
  }

  status.GetMakefile().AddDefinition(command.OutputName,
                                     cmJoin(varArgsExpanded, ";"));

  return true;
}